

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O2

void __thiscall
NaStateSpaceModel::SetMatrices(NaStateSpaceModel *this,NaMatrix *mA,NaMatrix *mB,NaMatrix *mC)

{
  NaMatrix *this_00;
  NaMatrix *this_01;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint nC;
  undefined4 *puVar4;
  
  iVar1 = (*mA->_vptr_NaMatrix[7])(mA);
  if (iVar1 != 0) {
    iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
    if (iVar1 != 0) {
      iVar1 = (*mB->_vptr_NaMatrix[7])(mB);
      if (iVar1 != 0) {
        iVar1 = (*mB->_vptr_NaMatrix[6])(mB);
        if (iVar1 != 0) {
          iVar1 = (*mC->_vptr_NaMatrix[7])(mC);
          if (iVar1 != 0) {
            iVar1 = (*mC->_vptr_NaMatrix[6])(mC);
            if (iVar1 != 0) {
              iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
              iVar2 = (*mA->_vptr_NaMatrix[7])(mA);
              if (iVar1 == iVar2) {
                iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                iVar2 = (*mB->_vptr_NaMatrix[6])(mB);
                if (iVar1 == iVar2) {
                  iVar1 = (*mA->_vptr_NaMatrix[6])(mA);
                  iVar2 = (*mC->_vptr_NaMatrix[7])(mC);
                  if (iVar1 == iVar2) {
                    NaMatrix::operator=(&this->A,mA);
                    this_00 = &this->B;
                    NaMatrix::operator=(this_00,mB);
                    this_01 = &this->C;
                    NaMatrix::operator=(this_01,mC);
                    uVar3 = NaMatrix::dim_rows(this_01);
                    nC = NaMatrix::dim_cols(this_00);
                    NaMatrix::new_dim(&this->D,uVar3,nC);
                    NaMatrix::init_zero(&this->D);
                    uVar3 = NaMatrix::dim_rows(&this->A);
                    this->n = uVar3;
                    uVar3 = NaMatrix::dim_rows(this_01);
                    this->m = uVar3;
                    uVar3 = NaMatrix::dim_cols(this_00);
                    this->k = uVar3;
                    NaUnit::Assign(&this->super_NaUnit,uVar3,this->m,0);
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  puVar4 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar4 = 2;
  __cxa_throw(puVar4,&NaException::typeinfo,0);
}

Assistant:

void
NaStateSpaceModel::SetMatrices (const NaMatrix& mA,
				const NaMatrix& mB,
				const NaMatrix& mC)
{
    if(!(mA.dim_cols() > 0 && mA.dim_rows() > 0 &&
         mB.dim_cols() > 0 && mB.dim_rows() > 0 &&
         mC.dim_cols() > 0 && mC.dim_rows() > 0 &&
         mA.dim_rows() == mA.dim_cols() &&
         mA.dim_rows() == mB.dim_rows() &&
         mA.dim_rows() == mC.dim_cols())){
         throw(na_size_mismatch);
    }

    A = mA;
    B = mB;
    C = mC;
    D.new_dim(C.dim_rows(), B.dim_cols());
    D.init_zero();

    n = A.dim_rows();
    m = C.dim_rows();
    k = B.dim_cols();

    Assign(k, m);
}